

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_do_all.cc
# Opt level: O0

void EVP_MD_do_all_sorted(fn *fn,void *arg)

{
  EVP_MD *pEVar1;
  void *arg_local;
  _func_void_EVP_MD_ptr_char_ptr_char_ptr_void_ptr *callback_local;
  
  pEVar1 = EVP_md4();
  (*fn)(pEVar1,"MD4",(char *)0x0,arg);
  pEVar1 = EVP_md5();
  (*fn)(pEVar1,"MD5",(char *)0x0,arg);
  pEVar1 = EVP_sha1();
  (*fn)(pEVar1,"SHA1",(char *)0x0,arg);
  pEVar1 = EVP_sha224();
  (*fn)(pEVar1,"SHA224",(char *)0x0,arg);
  pEVar1 = EVP_sha256();
  (*fn)(pEVar1,"SHA256",(char *)0x0,arg);
  pEVar1 = EVP_sha384();
  (*fn)(pEVar1,"SHA384",(char *)0x0,arg);
  pEVar1 = EVP_sha512();
  (*fn)(pEVar1,"SHA512",(char *)0x0,arg);
  pEVar1 = (EVP_MD *)EVP_sha512_256();
  (*fn)(pEVar1,"SHA512-256",(char *)0x0,arg);
  pEVar1 = EVP_md4();
  (*fn)(pEVar1,"md4",(char *)0x0,arg);
  pEVar1 = EVP_md5();
  (*fn)(pEVar1,"md5",(char *)0x0,arg);
  pEVar1 = EVP_sha1();
  (*fn)(pEVar1,"sha1",(char *)0x0,arg);
  pEVar1 = EVP_sha224();
  (*fn)(pEVar1,"sha224",(char *)0x0,arg);
  pEVar1 = EVP_sha256();
  (*fn)(pEVar1,"sha256",(char *)0x0,arg);
  pEVar1 = EVP_sha384();
  (*fn)(pEVar1,"sha384",(char *)0x0,arg);
  pEVar1 = EVP_sha512();
  (*fn)(pEVar1,"sha512",(char *)0x0,arg);
  pEVar1 = (EVP_MD *)EVP_sha512_256();
  (*fn)(pEVar1,"sha512-256",(char *)0x0,arg);
  return;
}

Assistant:

void EVP_MD_do_all_sorted(void (*callback)(const EVP_MD *cipher,
                                           const char *name, const char *unused,
                                           void *arg),
                          void *arg) {
  callback(EVP_md4(), "MD4", NULL, arg);
  callback(EVP_md5(), "MD5", NULL, arg);
  callback(EVP_sha1(), "SHA1", NULL, arg);
  callback(EVP_sha224(), "SHA224", NULL, arg);
  callback(EVP_sha256(), "SHA256", NULL, arg);
  callback(EVP_sha384(), "SHA384", NULL, arg);
  callback(EVP_sha512(), "SHA512", NULL, arg);
  callback(EVP_sha512_256(), "SHA512-256", NULL, arg);

  callback(EVP_md4(), "md4", NULL, arg);
  callback(EVP_md5(), "md5", NULL, arg);
  callback(EVP_sha1(), "sha1", NULL, arg);
  callback(EVP_sha224(), "sha224", NULL, arg);
  callback(EVP_sha256(), "sha256", NULL, arg);
  callback(EVP_sha384(), "sha384", NULL, arg);
  callback(EVP_sha512(), "sha512", NULL, arg);
  callback(EVP_sha512_256(), "sha512-256", NULL, arg);
}